

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O0

void __thiscall YdiskRestClient::removeResource(YdiskRestClient *this,string *utf8Path)

{
  SSLClient *path;
  Headers *headers;
  element_type *peVar1;
  element_type *peVar2;
  undefined1 local_80 [8];
  shared_ptr<httplib::Response> r;
  allocator local_39;
  string local_38 [8];
  string url;
  string *utf8Path_local;
  YdiskRestClient *this_local;
  
  url.field_2._8_8_ = utf8Path;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"/v1/disk/resources?path=",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  url_encode((string *)
             &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this,
             utf8Path);
  std::__cxx11::string::operator+=
            (local_38,(string *)
                      &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::__cxx11::string::~string
            ((string *)
             &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  path = this->http_client;
  headers = (Headers *)std::__cxx11::string::c_str();
  httplib::Client::Delete((Client *)local_80,(char *)path,headers);
  peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_80);
  if ((peVar1 == (element_type *)0x0) ||
     (peVar2 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80), peVar2->status != 0xcc)) {
    peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_80);
    if ((peVar1 == (element_type *)0x0) ||
       (peVar2 = std::
                 __shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80), peVar2->status != 0xca)) {
      peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_80);
      throw_response_error(this,peVar1);
    }
    else {
      peVar2 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80);
      wait_success_operation(this,&peVar2->body);
    }
  }
  std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_80);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void YdiskRestClient::removeResource(std::string utf8Path)
{
    std::string url("/v1/disk/resources?path=");
    url += url_encode(utf8Path);
    auto r = http_client->Delete(url.c_str(), headers);

    if(r.get() && r->status==204){
        //empty folder or file was removed
        return;
    } else if(r.get() && r->status==202){
        //not empty folder is removing, get operation status
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}